

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_conf_max_frag_len(mbedtls_ssl_config *conf,uchar mfl_code)

{
  int iVar1;
  
  iVar1 = -0x7100;
  if (mfl_code < 5) {
    *(uint *)&conf->field_0x174 = *(uint *)&conf->field_0x174 & 0xfffffc7f | (uint)mfl_code << 7;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_conf_max_frag_len( mbedtls_ssl_config *conf, unsigned char mfl_code )
{
    if( mfl_code >= MBEDTLS_SSL_MAX_FRAG_LEN_INVALID ||
        mfl_code_to_length[mfl_code] > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    conf->mfl_code = mfl_code;

    return( 0 );
}